

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Promise.h
# Opt level: O0

void __thiscall async_simple::Promise<std::error_code>::~Promise(Promise<std::error_code> *this)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  runtime_error *this_00;
  char *pcVar5;
  long *in_RDI;
  __int_type old;
  __int_type_conflict3 old_1;
  FutureState<std::error_code> *in_stack_ffffffffffffff10;
  void *pvVar6;
  
  if (*in_RDI != 0) {
    pvVar6 = (void *)*in_RDI;
    plVar4 = (long *)((long)pvVar6 + 0x50);
    LOCK();
    lVar2 = *plVar4;
    *plVar4 = *plVar4 + -1;
    UNLOCK();
    bVar3 = FutureState<std::error_code>::hasResult(in_stack_ffffffffffffff10);
    if ((!bVar3) && (lVar2 == 1)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Promise is broken");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar5 = (char *)((long)pvVar6 + 1);
    LOCK();
    cVar1 = *pcVar5;
    *pcVar5 = *pcVar5 + -1;
    UNLOCK();
    if ((cVar1 == '\x01') && (pvVar6 != (void *)0x0)) {
      FutureState<std::error_code>::~FutureState((FutureState<std::error_code> *)0x2597f4);
      operator_delete(pvVar6,0x60);
    }
  }
  return;
}

Assistant:

~Promise() {
        if (_sharedState) {
            _sharedState->detachPromise();
        }
    }